

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O3

void dumpStats(DGLLVMPointerAnalysis *pta)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  byte bVar4;
  long *plVar5;
  size_t num;
  ulong uVar6;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> _Var7;
  long *plVar8;
  size_t num_1;
  ulong uVar9;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *node;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  long lVar19;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *node_1;
  long lVar20;
  long *plVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  const_iterator __begin2;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  const_iterator local_48;
  
  printf("Pointer subgraph size: %zu\n");
  lVar15 = dg::Offset::UNKNOWN;
  plVar10 = (long *)(pta->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.entryFunction
                    ._M_string_length;
  plVar3 = (long *)(pta->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.entryFunction.
                   field_2._M_allocated_capacity;
  if (plVar10 == plVar3) {
    local_f0 = 0;
    local_c0 = 0;
    local_e0 = 0;
    local_d8 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_a8 = 0;
    local_f8 = 0;
    lVar19 = 0;
    lVar18 = 0;
    local_e8 = 0;
    local_c8 = 0;
    local_b0 = 0;
    local_d0 = 0;
    local_b8 = 0;
    uVar9 = 0;
    lVar20 = 0;
  }
  else {
    lVar20 = 0;
    uVar9 = 0;
    local_b8 = 0;
    local_d0 = 0;
    local_b0 = 0;
    local_c8 = 0;
    local_e8 = 0;
    lVar18 = 0;
    lVar19 = 0;
    local_f8 = 0;
    local_a8 = 0;
    local_98 = 0;
    local_a0 = 0;
    local_d8 = 0;
    local_e0 = 0;
    local_c0 = 0;
    local_f0 = 0;
    do {
      lVar1 = *plVar10;
      if (lVar1 != 0) {
        local_48.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
              (lVar1 + 0xc0);
        lVar20 = (lVar20 + 1) - (ulong)(*(long *)(lVar1 + 200) == 0);
        if (local_48.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0) {
          lVar11 = 0;
          _Var7 = local_48.container_it.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                  _M_cur;
          do {
            uVar6 = *(ulong *)((long)&((_Var7._M_cur)->
                                      super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                      ._M_storage._M_storage + 8);
            lVar14 = 0;
            if (uVar6 != 0) {
              do {
                lVar14 = lVar14 + (ulong)((uint)uVar6 & 1);
                bVar2 = 1 < uVar6;
                uVar6 = uVar6 >> 1;
              } while (bVar2);
            }
            lVar11 = lVar11 + lVar14;
            _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt;
          } while (_Var7._M_cur != (__node_type *)0x0);
          if (lVar11 == 1) {
            local_e8 = local_e8 + 1;
            if ((*(int *)(lVar1 + 0x90) == 0x12) || (*(int *)(lVar1 + 0x90) == 7)) {
              local_f0 = local_f0 + 1;
            }
          }
          uVar6 = 0;
          _Var7 = local_48.container_it.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                  _M_cur;
          do {
            uVar12 = *(ulong *)((long)&((_Var7._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                       ._M_storage._M_storage + 8);
            lVar11 = 0;
            if (uVar12 != 0) {
              do {
                lVar11 = lVar11 + (ulong)((uint)uVar12 & 1);
                bVar2 = 1 < uVar12;
                uVar12 = uVar12 >> 1;
              } while (bVar2);
            }
            uVar6 = uVar6 + lVar11;
            _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt;
          } while (_Var7._M_cur != (__node_type *)0x0);
          if (uVar9 < uVar6) {
            uVar9 = 0;
            _Var7 = local_48.container_it.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                    _M_cur;
            do {
              uVar6 = *(ulong *)((long)&((_Var7._M_cur)->
                                        super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                        ._M_storage._M_storage + 8);
              lVar11 = 0;
              if (uVar6 != 0) {
                do {
                  lVar11 = lVar11 + (ulong)((uint)uVar6 & 1);
                  bVar2 = 1 < uVar6;
                  uVar6 = uVar6 >> 1;
                } while (bVar2);
              }
              uVar9 = uVar9 + lVar11;
              _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt;
            } while (_Var7._M_cur != (__node_type *)0x0);
          }
        }
        local_48.container_end.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             (__node_type *)0x0;
        local_48.pos = 0;
        if (*(long *)(lVar1 + 200) != 0) {
          uVar6 = *(ulong *)((long)&(((__node_type *)
                                     local_48.container_it.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                     ._M_cur)->
                                    super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                    ._M_storage._M_storage + 8);
          local_48.pos = 0;
          uVar12 = uVar6 & 1;
          while (uVar12 == 0) {
            if (local_48.pos == 0x3f) {
              local_48.pos = 0x40;
              break;
            }
            bVar4 = (byte)local_48.pos;
            local_48.pos = local_48.pos + 1;
            uVar12 = uVar6 >> (bVar4 & 0x3f) & 2;
          }
        }
        if ((local_48.pos == 0) &&
           (local_48.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            == (__node_type *)0x0)) {
          local_f8 = local_f8 + 1;
          lVar19 = lVar19 + 1;
        }
        else {
          bVar2 = true;
          bVar17 = 1;
          bVar4 = 1;
          do {
            lVar11 = local_48.pos * 0x10 + __M_assign;
            lVar14 = *(long *)&(((_Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  *)((long)local_48.container_it.
                                           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                           ._M_cur + 8))->
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                               )._M_storage._M_storage * 0x10;
            lVar1 = *(long *)(lVar14 + -0x10 + lVar11);
            if (*(long *)(lVar14 + -8 + lVar11) == lVar15) {
              bVar17 = 0;
            }
            if (lVar1 == dg::pta::UNKNOWN_MEMORY) {
              local_b8 = local_b8 + 1;
              plVar5 = *(long **)(*plVar10 + 0xc0);
              if (plVar5 != (long *)0x0) {
                lVar11 = 0;
                do {
                  uVar6 = plVar5[2];
                  lVar14 = 0;
                  if (uVar6 != 0) {
                    do {
                      lVar14 = lVar14 + (ulong)((uint)uVar6 & 1);
                      bVar2 = 1 < uVar6;
                      uVar6 = uVar6 >> 1;
                    } while (bVar2);
                  }
                  lVar11 = lVar11 + lVar14;
                  plVar5 = (long *)*plVar5;
                } while (plVar5 != (long *)0x0);
                local_d0 = local_d0 + (ulong)(lVar11 == 1);
              }
              bVar2 = false;
            }
            if (lVar1 == dg::pta::INVALIDATED) {
              local_b0 = local_b0 + 1;
              plVar5 = *(long **)(*plVar10 + 0xc0);
              if (plVar5 != (long *)0x0) {
                lVar11 = 0;
                do {
                  uVar6 = plVar5[2];
                  lVar14 = 0;
                  if (uVar6 != 0) {
                    do {
                      lVar14 = lVar14 + (ulong)((uint)uVar6 & 1);
                      bVar2 = 1 < uVar6;
                      uVar6 = uVar6 >> 1;
                    } while (bVar2);
                  }
                  lVar11 = lVar11 + lVar14;
                  plVar5 = (long *)*plVar5;
                } while (plVar5 != (long *)0x0);
                local_c8 = local_c8 + (ulong)(lVar11 == 1);
              }
              bVar2 = false;
            }
            if (lVar1 == 0 || *(int *)(lVar1 + 0x90) != 1) {
              local_a0 = local_a0 + (ulong)(*(int *)(lVar1 + 0x90) == 7);
              bVar4 = 0;
            }
            else {
              local_a8 = local_a8 + 1;
              lVar11 = *(long *)(*plVar10 + 0x88);
              local_98 = local_98 + (ulong)(lVar11 != lVar15 && lVar11 != 0);
              if (lVar11 == lVar15 || lVar11 == 0) {
                bVar4 = 0;
              }
              if (*(char *)(lVar1 + 0xe9) == '\x01') {
                local_c0 = local_c0 + 1;
              }
              else if (*(char *)(lVar1 + 0xea) == '\x01') {
                local_e0 = local_e0 + 1;
              }
              else {
                local_d8 = local_d8 + 1;
              }
            }
            bVar2 = (bool)(lVar1 != dg::pta::NULLPTR & bVar2);
            dg::ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator++(&local_48);
          } while (local_48.container_it.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur != (__node_type *)0x0 || local_48.pos != 0);
          uVar6 = (ulong)bVar17;
          local_f8 = local_f8 + (ulong)bVar4;
          if (bVar4 == 0) {
            uVar6 = 0;
          }
          lVar19 = lVar19 + uVar6;
          if (!bVar2) goto LAB_00111ce7;
        }
        lVar18 = lVar18 + 1;
      }
LAB_00111ce7:
      plVar10 = plVar10 + 1;
    } while (plVar10 != plVar3);
  }
  printf("Allocations: %zu\n",local_a8);
  printf("Allocations with known size: %zu\n",local_98);
  printf("Nodes with non-empty pt-set: %zu\n",lVar20);
  printf("Pointers pointing only to known-size allocations: %zu\n",local_f8);
  printf("Pointers pointing only to known-size allocations with known offset: %zu\n",lVar19);
  printf("Pointers pointing only to valid targets: %zu\n",lVar18);
  printf("Pointers pointing only to valid targets and some known size+offset: %zu\n");
  plVar3 = (long *)(pta->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.entryFunction.
                   _M_string_length;
  plVar10 = (long *)(pta->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.entryFunction
                    .field_2._M_allocated_capacity;
  auVar23._8_4_ = (int)((ulong)lVar20 >> 0x20);
  auVar23._0_8_ = lVar20;
  auVar23._12_4_ = 0x45300000;
  dVar31 = 0.0;
  if (plVar3 == plVar10) {
    dVar22 = 0.0;
    plVar5 = plVar3;
  }
  else {
    uVar6 = 0;
    plVar5 = plVar10;
    plVar21 = plVar3;
    do {
      if (*plVar21 != 0) {
        plVar8 = *(long **)(*plVar21 + 0xc0);
        if (plVar8 == (long *)0x0) {
          uVar12 = 0xffffffffffffffff;
        }
        else {
          uVar12 = 0;
          plVar13 = plVar8;
          do {
            uVar16 = plVar13[2];
            lVar15 = 0;
            if (uVar16 != 0) {
              do {
                lVar15 = lVar15 + (ulong)((uint)uVar16 & 1);
                bVar2 = 1 < uVar16;
                uVar16 = uVar16 >> 1;
              } while (bVar2);
            }
            uVar12 = uVar12 + lVar15;
            plVar13 = (long *)*plVar13;
          } while (plVar13 != (long *)0x0);
          uVar12 = ~uVar12;
        }
        if (uVar12 < uVar6) {
          printf("Accumulated points to sets size > 2^64 - 1");
          auVar25._8_4_ = (int)(uVar6 >> 0x20);
          auVar25._0_8_ = uVar6;
          auVar25._12_4_ = 0x45300000;
          dVar22 = (double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0;
          dVar28 = auVar25._8_8_ - 1.9342813113834067e+25;
          plVar3 = (long *)(pta->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.
                           entryFunction._M_string_length;
          plVar5 = (long *)(pta->super_LLVMPointerAnalysis).options.super_LLVMAnalysisOptions.
                           entryFunction.field_2._M_allocated_capacity;
          lVar15 = ((long)plVar5 - (long)plVar3 >> 3) + -1;
          auVar29._8_4_ = (int)((ulong)lVar15 >> 0x20);
          auVar29._0_8_ = lVar15;
          auVar29._12_4_ = 0x45300000;
          auVar30._0_8_ =
               (auVar29._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0);
          auVar24._0_8_ = dVar28 + dVar22;
          auVar24._8_8_ = dVar28 + dVar22;
          auVar30._8_8_ =
               (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
          auVar25 = divpd(auVar24,auVar30);
          dVar31 = dVar31 + auVar25._0_8_;
          plVar8 = *(long **)(*plVar21 + 0xc0);
          uVar6 = 0;
        }
        lVar15 = 0;
        for (; plVar8 != (long *)0x0; plVar8 = (long *)*plVar8) {
          uVar12 = plVar8[2];
          lVar18 = 0;
          if (uVar12 != 0) {
            do {
              lVar18 = lVar18 + (ulong)((uint)uVar12 & 1);
              bVar2 = 1 < uVar12;
              uVar12 = uVar12 >> 1;
            } while (bVar2);
          }
          lVar15 = lVar15 + lVar18;
        }
        uVar6 = uVar6 + lVar15;
      }
      plVar21 = plVar21 + 1;
    } while (plVar21 != plVar10);
    auVar26._8_4_ = (int)(uVar6 >> 0x20);
    auVar26._0_8_ = uVar6;
    auVar26._12_4_ = 0x45300000;
    dVar22 = (auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
  }
  lVar15 = ((long)plVar5 - (long)plVar3 >> 3) + -1;
  auVar27._8_4_ = (int)((ulong)lVar15 >> 0x20);
  auVar27._0_8_ = lVar15;
  auVar27._12_4_ = 0x45300000;
  printf("Average pt-set size: %6.3f\n",
         dVar22 / ((auVar27._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) + dVar31);
  printf("Average non-empty pt-set size: %6.3f\n");
  printf("Pointing to singleton: %zu\n",local_e8);
  printf("Non-constant pointing to singleton: %zu\n",local_f0);
  printf("Pointing to unknown: %zu\n",local_b8);
  printf("Pointing to unknown singleton: %zu\n",local_d0);
  printf("Pointing to invalidated: %zu\n",local_b0);
  printf("Pointing to invalidated singleton: %zu\n",local_c8);
  printf("Pointing to heap: %zu\n",local_c0);
  printf("Pointing to global: %zu\n",local_e0);
  printf("Pointing to stack: %zu\n",local_d8);
  printf("Pointing to function: %zu\n",local_a0);
  printf("Maximum pt-set size: %zu\n",uVar9);
  return;
}

Assistant:

static void dumpStats(DGLLVMPointerAnalysis *pta) {
    const auto &nodes = pta->getNodes();
    printf("Pointer subgraph size: %zu\n", nodes.size() - 1);

    size_t nonempty_size = 0; // number of nodes with non-empty pt-set
    size_t maximum = 0;       // maximum pt-set size
    size_t pointing_to_unknown = 0;
    size_t pointing_only_to_unknown = 0;
    size_t pointing_to_invalidated = 0;
    size_t pointing_only_to_invalidated = 0;
    size_t singleton_count = 0;
    size_t singleton_nonconst_count = 0;
    size_t pointing_to_heap = 0;
    size_t pointing_to_global = 0;
    size_t pointing_to_stack = 0;
    size_t pointing_to_function = 0;
    size_t has_known_size = 0;
    size_t allocation_num = 0;
    size_t points_to_only_known_size = 0;
    size_t known_size_known_offset = 0;
    size_t only_valid_target = 0;
    size_t only_valid_and_some_known = 0;

    for (const auto &node : nodes) {
        if (!node)
            continue;

        if (!node->pointsTo.empty())
            ++nonempty_size;

        if (node->pointsTo.size() == 1) {
            ++singleton_count;
            if (node->getType() == PSNodeType::CONSTANT ||
                node->getType() == PSNodeType::FUNCTION)
                ++singleton_nonconst_count;
        }

        if (node->pointsTo.size() > maximum)
            maximum = node->pointsTo.size();

        bool _points_to_only_known_size = true;
        bool _known_offset_only = true;
        bool _has_known_size_offset = false;
        bool _has_only_valid_targets = true;
        for (const auto &ptr : node->pointsTo) {
            if (ptr.offset.isUnknown()) {
                _known_offset_only = false;
            }

            if (ptr.isUnknown()) {
                _has_only_valid_targets = false;
                ++pointing_to_unknown;
                if (node->pointsTo.size() == 1)
                    ++pointing_only_to_unknown;
            }

            if (ptr.isInvalidated()) {
                _has_only_valid_targets = false;
                ++pointing_to_invalidated;
                if (node->pointsTo.size() == 1)
                    ++pointing_only_to_invalidated;
            }

            if (ptr.isNull()) {
                _has_only_valid_targets = false;
            }

            auto *alloc = PSNodeAlloc::get(ptr.target);
            if (alloc) {
                ++allocation_num;
                if (node->getSize() != 0 &&
                    node->getSize() != Offset::UNKNOWN) {
                    ++has_known_size;
                    if (!ptr.offset.isUnknown())
                        _has_known_size_offset = true;
                } else
                    _points_to_only_known_size = false;

                if (alloc->isHeap()) {
                    ++pointing_to_heap;
                } else if (alloc->isGlobal()) {
                    ++pointing_to_global;
                } else if (alloc->getType() == PSNodeType::ALLOC) {
                    assert(!alloc->isGlobal());
                    ++pointing_to_stack;
                }
            } else {
                _points_to_only_known_size = false;
                ;

                if (ptr.target->getType() == PSNodeType::FUNCTION) {
                    ++pointing_to_function;
                }
            }
        }

        if (_points_to_only_known_size) {
            ++points_to_only_known_size;
            if (_known_offset_only)
                ++known_size_known_offset;
        }

        if (_has_only_valid_targets) {
            ++only_valid_target;
            if (_has_known_size_offset)
                ++only_valid_and_some_known;
        }
    }

    printf("Allocations: %zu\n", allocation_num);
    printf("Allocations with known size: %zu\n", has_known_size);
    printf("Nodes with non-empty pt-set: %zu\n", nonempty_size);
    printf("Pointers pointing only to known-size allocations: %zu\n",
           points_to_only_known_size);
    printf("Pointers pointing only to known-size allocations with known "
           "offset: %zu\n",
           known_size_known_offset);
    printf("Pointers pointing only to valid targets: %zu\n", only_valid_target);
    printf("Pointers pointing only to valid targets and some known "
           "size+offset: %zu\n",
           only_valid_and_some_known);

    double avg_ptset_size = 0;
    double avg_nonempty_ptset_size = 0; // avg over non-empty sets only
    size_t accumulated_ptset_size = 0;

    for (const auto &node : nodes) {
        if (!node)
            continue;

        if (accumulated_ptset_size > (~((size_t) 0)) - node->pointsTo.size()) {
            printf("Accumulated points to sets size > 2^64 - 1");
            avg_ptset_size += (accumulated_ptset_size /
                               static_cast<double>(nodes.size() - 1));
            avg_nonempty_ptset_size += (accumulated_ptset_size /
                                        static_cast<double>(nonempty_size));
            accumulated_ptset_size = 0;
        }
        accumulated_ptset_size += node->pointsTo.size();
    }

    avg_ptset_size +=
            (accumulated_ptset_size / static_cast<double>(nodes.size() - 1));
    avg_nonempty_ptset_size +=
            (accumulated_ptset_size / static_cast<double>(nonempty_size));
    printf("Average pt-set size: %6.3f\n", avg_ptset_size);
    printf("Average non-empty pt-set size: %6.3f\n", avg_nonempty_ptset_size);
    printf("Pointing to singleton: %zu\n", singleton_count);
    printf("Non-constant pointing to singleton: %zu\n",
           singleton_nonconst_count);
    printf("Pointing to unknown: %zu\n", pointing_to_unknown);
    printf("Pointing to unknown singleton: %zu\n", pointing_only_to_unknown);
    printf("Pointing to invalidated: %zu\n", pointing_to_invalidated);
    printf("Pointing to invalidated singleton: %zu\n",
           pointing_only_to_invalidated);
    printf("Pointing to heap: %zu\n", pointing_to_heap);
    printf("Pointing to global: %zu\n", pointing_to_global);
    printf("Pointing to stack: %zu\n", pointing_to_stack);
    printf("Pointing to function: %zu\n", pointing_to_function);
    printf("Maximum pt-set size: %zu\n", maximum);
}